

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O0

t_int * sigwrap_perform(t_int *w)

{
  float fVar1;
  int iVar2;
  t_sample f;
  int k;
  int n;
  t_sample *out;
  t_sample *in;
  t_int *w_local;
  
  _k = (float *)w[2];
  f = (t_sample)w[3];
  out = (t_sample *)w[1];
  while (f != 0.0) {
    fVar1 = *out;
    if ((2.1474836e+09 < fVar1) || (fVar1 < -2.1474836e+09)) {
      fVar1 = 0.0;
    }
    iVar2 = (int)fVar1;
    if (fVar1 < (float)iVar2) {
      *_k = fVar1 - (float)(iVar2 + -1);
    }
    else {
      *_k = fVar1 - (float)iVar2;
    }
    _k = _k + 1;
    f = (t_sample)((int)f + -1);
    out = out + 1;
  }
  return w + 4;
}

Assistant:

static t_int *sigwrap_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    while (n--)
    {
        int k;
        t_sample f = *in++;
        f = (f>INT_MAX || f<INT_MIN)?0.:f;
        k = (int)f;
        if (k <= f) *out++ = f-k;
        else *out++ = f - (k-1);
    }
    return (w + 4);
}